

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

_Bool bson_iter_find_descendant(bson_iter_t *iter,char *dotkey,bson_iter_t *descendant)

{
  uint8_t **ppuVar1;
  size_t *psVar2;
  long *plVar3;
  uint8_t uVar4;
  uint uVar5;
  size_t sVar6;
  double dVar7;
  long lVar8;
  int64_t iVar9;
  _Bool _Var10;
  undefined1 extraout_AL;
  undefined1 uVar11;
  char cVar12;
  bson_type_t bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  size_t sVar18;
  ulong uVar19;
  void *pvVar20;
  undefined8 uVar21;
  code *pcVar22;
  bson_oid_t *pbVar23;
  char *__s;
  ulong uVar24;
  uint uVar25;
  ulong *in_RCX;
  long lVar26;
  uint8_t *puVar27;
  ulong uVar28;
  int32_t iVar29;
  uint *extraout_RDX;
  int *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  ulong *extraout_RDX_02;
  undefined4 *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  bson_error_t *error;
  size_t __n;
  bson_iter_t *unaff_RBX;
  bson_json_destroy_cb p_Var30;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  size_t sVar31;
  bson_error_t *__s_00;
  bson_t *pbVar32;
  uint uVar33;
  uint uVar34;
  uint8_t *puVar35;
  uint uVar36;
  char *unaff_R12;
  uint32_t uVar37;
  bool bVar38;
  byte bVar39;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_iter_t tmp;
  bson_error_t bStack_660;
  bson_iter_t *pbStack_460;
  char *pcStack_458;
  uint32_t uStack_3a0;
  _Bool _Stack_399;
  bson_t *pbStack_398;
  uint32_t uStack_390;
  uint32_t uStack_38c;
  uint8_t *puStack_388;
  char *apcStack_380 [45];
  bson_iter_t *pbStack_218;
  char *pcStack_210;
  bson_iter_t local_100 [2];
  
  bVar39 = 0;
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_find_descendant_cold_3();
LAB_001109cc:
    bson_iter_find_descendant_cold_2();
  }
  else {
    unaff_R12 = dotkey;
    if (dotkey == (char *)0x0) goto LAB_001109cc;
    unaff_RBX = descendant;
    if (descendant != (bson_iter_t *)0x0) {
      pcVar17 = strchr(dotkey,0x2e);
      if (pcVar17 == (char *)0x0) {
        sVar18 = strlen(dotkey);
        _Var10 = _bson_iter_find_with_len(iter,dotkey,(int)sVar18);
        if (_Var10) {
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            descendant->raw = iter->raw;
            iter = (bson_iter_t *)((long)iter + (ulong)bVar39 * -0x10 + 8);
            descendant = (bson_iter_t *)((long)descendant + (ulong)bVar39 * -0x10 + 8);
          }
          return true;
        }
      }
      else {
        _Var10 = _bson_iter_find_with_len(iter,dotkey,(int)pcVar17 - (int)dotkey);
        if ((_Var10) &&
           (((bVar13 = bson_iter_type(iter), bVar13 == BSON_TYPE_DOCUMENT ||
             (bVar13 = bson_iter_type(iter), bVar13 == BSON_TYPE_ARRAY)) &&
            (puVar35 = iter->raw, (byte)(puVar35[iter->type] - 3) < 2)))) {
          local_100[0].raw = puVar35 + iter->d1;
          local_100[0].len = *(uint32_t *)(puVar35 + iter->d1);
          local_100[0].off = 0;
          local_100[0].type = 0;
          local_100[0].key = 0;
          local_100[0].d1 = 0;
          local_100[0].d2 = 0;
          local_100[0].d3 = 0;
          local_100[0].d4 = 0;
          local_100[0].next_off = 4;
          local_100[0].err_off = 0;
          _Var10 = bson_iter_find_descendant(local_100,pcVar17 + 1,descendant);
          return _Var10;
        }
      }
      return false;
    }
  }
  bson_iter_find_descendant_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_type_cold_3();
LAB_001109f8:
    bson_iter_type_cold_2();
  }
  else {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35 == (uint8_t *)0x0) goto LAB_001109f8;
    if (*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).cb != 0) {
      return (_Bool)puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    }
  }
  bson_iter_type_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    *(undefined1 *)in_RCX = 0;
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35 == (uint8_t *)0x0) {
      ((bson_t *)dotkey)->flags = 0;
      ((bson_t *)dotkey)->len = 0;
      *extraout_RDX = 0;
      return false;
    }
    uVar15 = *(uint *)&(((bson_json_reader_t *)iter)->producer).cb;
    uVar25 = (uint)(((bson_json_reader_t *)iter)->producer).bytes_read;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4) = uVar25;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb = uVar25;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4) = uVar25 + 1;
    ppuVar1 = &(((bson_json_reader_t *)iter)->producer).buf;
    (((bson_json_reader_t *)iter)->producer).buf = (uint8_t *)0x0;
    (((bson_json_reader_t *)iter)->producer).buf_size = 0;
    uVar33 = uVar25;
    do {
      uVar34 = uVar33;
      uVar33 = uVar34 + 1;
      if (uVar15 <= uVar33) goto LAB_00110d0d;
    } while (puVar35[uVar33] != '\0');
    uVar14 = uVar34 + 2;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).buf = uVar14;
    *(uint8_t **)dotkey = puVar35 + (uVar25 + 1);
    puVar27 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar39 = puVar27[uVar25];
    *extraout_RDX = (uint)bVar39;
    uVar25 = uVar14;
    switch(bVar39) {
    case 0:
      break;
    case 1:
    case 9:
    case 0x11:
    case 0x12:
      uVar34 = uVar34 + 10;
      goto LAB_00110ab7;
    case 2:
    case 0xd:
    case 0xe:
      uVar36 = uVar34 + 6;
      if (uVar15 <= uVar36) break;
      *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar36;
      uVar5 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      if ((uVar15 - uVar33) - 5 < uVar5) break;
      uVar34 = uVar5 + uVar33 + 5;
      *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar34;
      if (uVar5 == 0) break;
      if (uVar15 <= uVar34) goto LAB_00110d0a;
      if (puVar27[(ulong)(uVar5 - 1) + (ulong)uVar36] != '\0') {
        uVar25 = uVar5 + uVar33 + 4;
        goto LAB_00110d0a;
      }
      goto LAB_00110aba;
    case 3:
    case 4:
      if ((uVar14 < uVar15 - 4) &&
         (uVar34 = *(uint *)(puVar27 + *(uint *)ppuVar1), uVar34 <= uVar15)) {
        if (~uVar33 + uVar15 < uVar34) goto LAB_00110d0a;
        uVar34 = uVar34 + uVar33 + 1;
        goto LAB_00110ab7;
      }
      break;
    case 5:
      if (uVar14 < uVar15 - 4) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar34 + 6;
        uVar25 = uVar34 + 7;
        *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar25;
        uVar36 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (uVar36 < ~uVar33 + uVar15) {
          if (puVar27[uVar34 + 6] == '\x02') {
            if (uVar36 < 4) break;
            if (*(int *)(puVar27 + uVar25) + 4U != uVar36) goto LAB_00110d0a;
          }
          uVar34 = uVar36 + uVar33 + 6;
          goto LAB_00110ab7;
        }
      }
      break;
    case 6:
    case 10:
switchD_00110a7e_caseD_6:
      *(uint32_t *)ppuVar1 = 0xffffffff;
      uVar34 = uVar14;
      goto LAB_00110ab7;
    case 7:
      uVar34 = uVar34 + 0xe;
      goto LAB_00110ab7;
    case 8:
      if ((*(uint *)ppuVar1 < uVar15) && (puVar27[*(uint *)ppuVar1] < 2)) {
        uVar34 = uVar34 + 3;
        goto LAB_00110ab7;
      }
      break;
    case 0xb:
      if (uVar14 < uVar15) {
        uVar34 = uVar34 + 3;
        uVar28 = (ulong)uVar14;
        do {
          uVar19 = (ulong)uVar34;
          if (puVar35[uVar28] == '\0') {
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar34;
            if (uVar34 < uVar15) {
              puVar35 = puVar35 + uVar19;
              goto LAB_00110d2e;
            }
            break;
          }
          uVar28 = uVar28 + 1;
          uVar34 = uVar34 + 1;
        } while (uVar28 < uVar15);
      }
      goto LAB_00110d3e;
    case 0xc:
      if (uVar14 < uVar15 - 4) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar34 + 6;
        uVar25 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (((ulong)uVar25 != 0) && (uVar25 <= (uVar15 - uVar33) - 5)) {
          if (puVar27[(ulong)uVar25 + 3 + (ulong)uVar14] != '\0') {
            uVar25 = uVar25 + uVar33 + 4;
            goto LAB_00110d0a;
          }
          *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar25 + uVar33 + 5;
          uVar34 = uVar25 + uVar33 + 0x11;
          goto LAB_00110ab7;
        }
      }
      break;
    case 0xf:
      if (0x12 < uVar15) {
        if (uVar15 - 0xe <= uVar14) goto LAB_00110d0a;
        uVar36 = uVar34 + 6;
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar36;
        *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar34 + 10;
        uVar34 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if ((0xd < uVar34) && (uVar34 < ~uVar33 + uVar15)) {
          uVar34 = uVar34 + uVar33 + 1;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar34;
          if ((uVar34 < uVar15) && (uVar5 = *(uint *)(puVar27 + uVar36), uVar5 != 0)) {
            if (((uVar15 - uVar33) - 9 <= uVar5) ||
               (uVar25 = uVar36, uVar34 <= uVar5 + uVar33 + 0xd)) goto LAB_00110d0a;
            uVar25 = uVar5 + uVar33 + 9;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4) = uVar25;
            if (uVar34 != uVar33 + uVar5 + *(int *)(puVar27 + uVar25) + 9) goto LAB_00110d0a;
            goto LAB_00110aba;
          }
        }
      }
      break;
    case 0x10:
      uVar34 = uVar34 + 6;
      goto LAB_00110ab7;
    case 0x13:
      uVar34 = uVar34 + 0x12;
LAB_00110ab7:
      *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar34;
LAB_00110aba:
      uVar25 = uVar14;
      if (uVar34 < uVar15) {
        *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = 0;
        return true;
      }
      goto LAB_00110d0a;
    default:
      if ((bVar39 == 0x7f) || (bVar39 == 0xff)) goto switchD_00110a7e_caseD_6;
      *(undefined1 *)in_RCX = 1;
    }
    uVar25 = uVar14;
LAB_00110d0a:
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar25;
LAB_00110d0d:
    (((bson_json_reader_t *)iter)->producer).data = (uint8_t *)0x0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).cb = 0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).bytes_read = 0;
    return false;
  }
  _bson_iter_next_internal_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_binary_cold_2();
  }
  else if (extraout_RDX_00 != (int *)0x0 || in_RCX == (ulong *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x05') {
      uVar15 = (uint)puVar35[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)]
      ;
      if ((bson_t *)dotkey == (bson_t *)0x0) {
        if (in_RCX == (ulong *)0x0) {
          return (_Bool)extraout_AL;
        }
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        *extraout_RDX_00 = iVar16;
        puVar35 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar35;
      }
      else {
        ((bson_t *)dotkey)->flags =
             (uint)puVar35[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)];
        if (in_RCX == (ulong *)0x0) {
          return (_Bool)extraout_AL;
        }
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        *extraout_RDX_00 = iVar16;
        puVar35 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar35;
        uVar15 = ((bson_t *)dotkey)->flags;
      }
      if (uVar15 == 2) {
        *extraout_RDX_00 = iVar16 + -4;
        *in_RCX = (ulong)(puVar35 + 4);
      }
    }
    else {
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      if (extraout_RDX_00 != (int *)0x0) {
        *extraout_RDX_00 = 0;
      }
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
    }
    return (_Bool)extraout_AL;
  }
  bson_iter_binary_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\b') {
      return false;
    }
    return puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0';
  }
  bson_iter_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar4 = puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    switch(uVar4) {
    case '\x01':
      return (_Bool)(-(*(double *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                      != 0.0) & 1);
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      return true;
    case '\x06':
    case '\n':
      return false;
    case '\b':
      bVar38 = puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] == '\0';
      break;
    default:
      if (uVar4 == '\x10') {
        bVar38 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0;
      }
      else {
        if (uVar4 != '\x12') {
          return true;
        }
        bVar38 = *(long *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0;
      }
    }
    return !bVar38;
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return SUB81((((bson_json_reader_t *)iter)->producer).data,0);
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x12') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar11 = 0;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      uVar11 = (undefined1)
               *(undefined4 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return (_Bool)uVar11;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar39 = puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    _Var10 = SUB81(puVar35,0);
    if (bVar39 < 0x10) {
      if (bVar39 == 1) {
        return _Var10;
      }
      if ((bVar39 == 8) && (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0')
         ) {
        return _Var10;
      }
    }
    else if ((bVar39 != 0x10) && (bVar39 == 0x12)) {
      return _Var10;
    }
    return _Var10;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar39 = puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    uVar11 = 0;
    if (bVar39 < 0x10) {
      if (bVar39 == 1) {
        return SUB81((long)*(double *)
                            (puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0);
      }
      if (bVar39 == 8) {
        return puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0';
      }
    }
    else if (bVar39 == 0x10) {
      uVar11 = (undefined1)
               *(undefined4 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else if (bVar39 == 0x12) {
      return SUB81(*(undefined8 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                   ,0);
    }
    return (_Bool)uVar11;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar4 = puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar4 == '\x13') {
      plVar3 = (long *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar26 = *plVar3;
      lVar8 = plVar3[1];
      ((bson_t *)dotkey)->flags = (int)lVar26;
      ((bson_t *)dotkey)->len = (int)((ulong)lVar26 >> 0x20);
      *(long *)((bson_t *)dotkey)->padding = lVar8;
    }
    return uVar4 == '\x13';
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return false;
    }
    return (_Bool)((char)puVar35 + (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf)
    ;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      cVar12 = (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf + (char)puVar35;
      puVar35 = puVar35 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      cVar12 = '\0';
      puVar35 = (uint8_t *)0x0;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      *(uint8_t **)dotkey = puVar35;
    }
    return (_Bool)cVar12;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
      return false;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      iVar16 = 1;
      if (1 < *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)dotkey)->flags = iVar16 - 1;
    }
    return (_Bool)((char)puVar35 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      uVar15 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      sVar31 = 1;
      if (1 < (int)*(uint *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        sVar31 = (size_t)*(uint *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
        ;
      }
      uVar37 = (int)sVar31 - 1;
      pvVar20 = bson_malloc0(sVar31);
      memcpy(pvVar20,puVar35 + uVar15,(ulong)uVar37);
      *(undefined1 *)((long)pvVar20 + (ulong)uVar37) = 0;
    }
    else {
      uVar37 = 0;
      pvVar20 = (void *)0x0;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      ((bson_t *)dotkey)->flags = uVar37;
    }
    return SUB81(pvVar20,0);
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
      return false;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      iVar16 = 1;
      if (1 < *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)dotkey)->flags = iVar16 - 1;
    }
    return (_Bool)((char)puVar35 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
      if (extraout_RDX_01 != (undefined4 *)0x0) {
        *extraout_RDX_01 = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return false;
    }
    if ((bson_t *)dotkey == (bson_t *)0x0) {
LAB_00111197:
      *extraout_RDX_01 =
           *(undefined4 *)
            (puVar35 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar35 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (_Bool)((char)(uint32_t)(((bson_json_reader_t *)iter)->producer).buf_size +
                    (char)(((bson_json_reader_t *)iter)->producer).data);
    }
    if (*(int *)(puVar35 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      ((bson_t *)dotkey)->flags =
           *(int *)(puVar35 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_00111197;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_02 != (ulong *)0x0) {
      *extraout_RDX_02 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        uVar15 = *(uint *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar35 = (uint8_t *)(ulong)uVar15;
        ((bson_t *)dotkey)->flags = uVar15;
        if (uVar15 != 0) {
          puVar35 = (uint8_t *)(ulong)(uVar15 - 1);
          ((bson_t *)dotkey)->flags = uVar15 - 1;
        }
      }
      if (extraout_RDX_02 != (ulong *)0x0) {
        puVar35 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_02 = (ulong)puVar35;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar35 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar35;
      }
    }
    return SUB81(puVar35,0);
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      cVar12 = (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) +
               (char)puVar35;
      iVar16 = 1;
      if (1 < *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar37 = iVar16 - 1;
    }
    else {
      cVar12 = '\0';
      uVar37 = 0;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      ((bson_t *)dotkey)->flags = uVar37;
    }
    return (_Bool)cVar12;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(ulong *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000
                 ,0);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar37 = 0;
    uVar21 = 0;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar21 = *(undefined8 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar37 = (uint32_t)((ulong)uVar21 >> 0x20);
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      ((bson_t *)dotkey)->flags = uVar37;
    }
    if (extraout_RDX_03 != (undefined4 *)0x0) {
      *extraout_RDX_03 = (int)uVar21;
    }
    return SUB81(uVar21,0);
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      ((bson_t *)dotkey)->flags = 0;
      ((bson_t *)dotkey)->len = 0;
      ((bson_t *)dotkey)->padding[0] = '\0';
      ((bson_t *)dotkey)->padding[1] = '\0';
      ((bson_t *)dotkey)->padding[2] = '\0';
      ((bson_t *)dotkey)->padding[3] = '\0';
      ((bson_t *)dotkey)->padding[4] = '\0';
      ((bson_t *)dotkey)->padding[5] = '\0';
      ((bson_t *)dotkey)->padding[6] = '\0';
      ((bson_t *)dotkey)->padding[7] = '\0';
      return SUB81(puVar35,0);
    }
    lVar26 = *(long *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)dotkey = lVar26 / 1000;
    lVar26 = (lVar26 % 1000) * 1000;
    *(long *)((bson_t *)dotkey)->padding = lVar26;
    return SUB81(lVar26,0);
  }
  bson_iter_timeval_cold_1();
  pbStack_218 = unaff_RBX;
  pcStack_210 = unaff_R12;
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)dotkey != (bson_t *)0x0) {
    _Var10 = _bson_iter_next_internal(iter,(char **)&puStack_388,&uStack_390,&_Stack_399);
    if (_Var10) {
      do {
        puVar35 = puStack_388;
        if (*puStack_388 != '\0') {
          sVar18 = strlen((char *)puStack_388);
          _Var10 = bson_utf8_validate((char *)puVar35,sVar18,false);
          if (!_Var10) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)dotkey != (code *)0x0) &&
           (cVar12 = (**(code **)dotkey)(iter,puVar35,extraout_RDX_04), cVar12 != '\0')) {
          return true;
        }
        switch(uStack_390) {
        case 1:
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x10);
          if (pcVar22 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          cVar12 = (*pcVar22)(SUB84(dVar7,0),iter,puVar35,extraout_RDX_04);
          goto LAB_001118b2;
        case 2:
          pcVar17 = bson_iter_utf8(iter,(uint32_t *)apcStack_380);
          _Var10 = bson_utf8_validate(pcVar17,(ulong)apcStack_380[0] & 0xffffffff,true);
          if (!_Var10) {
LAB_00111968:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return true;
          }
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_398 = (bson_t *)0x0;
          uStack_3a0 = 0;
          bson_iter_document(iter,&uStack_3a0,(uint8_t **)&pbStack_398);
          _Var10 = bson_init_static((bson_t *)apcStack_380,(uint8_t *)pbStack_398,(ulong)uStack_3a0)
          ;
          if (_Var10) {
            pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_398 = (bson_t *)0x0;
          uStack_3a0 = 0;
          bson_iter_array(iter,&uStack_3a0,(uint8_t **)&pbStack_398);
          _Var10 = bson_init_static((bson_t *)apcStack_380,(uint8_t *)pbStack_398,(ulong)uStack_3a0)
          ;
          if (_Var10) {
            pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_380[0] = (char *)0x0;
          pbStack_398 = (bson_t *)((ulong)pbStack_398 & 0xffffffff00000000);
          uStack_3a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_398,&uStack_3a0,(uint8_t **)apcStack_380)
          ;
          if (*(code **)(((bson_t *)dotkey)->padding + 0x30) != (code *)0x0) {
            cVar12 = (**(code **)(((bson_t *)dotkey)->padding + 0x30))
                               (iter,puVar35,(ulong)pbStack_398 & 0xffffffff,uStack_3a0,
                                apcStack_380[0],extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x40);
          if (pcVar22 != (code *)0x0) {
            pbVar23 = bson_iter_oid(iter);
LAB_001118a3:
            cVar12 = (*pcVar22)(iter,puVar35,pbVar23,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x48);
          if (pcVar22 != (code *)0x0) {
            _Var10 = bson_iter_bool(iter);
            uVar15 = (uint)_Var10;
LAB_00111710:
            cVar12 = (*pcVar22)(iter,puVar35,uVar15,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x50);
          if (pcVar22 != (code *)0x0) {
            pbVar23 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x58);
LAB_0011178a:
          if (pcVar22 == (code *)0x0) break;
LAB_00111799:
          cVar12 = (*pcVar22)(iter,puVar35,extraout_RDX_04);
          goto LAB_001118b2;
        case 0xb:
          apcStack_380[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_380);
          sVar18 = strlen(__s);
          _Var10 = bson_utf8_validate(__s,sVar18,true);
          if (!_Var10) goto LAB_00111968;
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x60);
          pcVar17 = apcStack_380[0];
          if (pcVar22 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_3a0 = 0;
          apcStack_380[0] = (char *)0x0;
          pbStack_398 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_3a0,apcStack_380,(bson_oid_t **)&pbStack_398);
          _Var10 = bson_utf8_validate(apcStack_380[0],(ulong)uStack_3a0,true);
          if (!_Var10) goto LAB_00111968;
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x68);
          pcVar17 = apcStack_380[0];
          pbVar32 = pbStack_398;
          if (pcVar22 != (code *)0x0) {
LAB_001115a8:
            cVar12 = (*pcVar22)(iter,puVar35,uStack_3a0,pcVar17,pbVar32,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar17 = bson_iter_code(iter,(uint32_t *)apcStack_380);
          _Var10 = bson_utf8_validate(pcVar17,(ulong)apcStack_380[0] & 0xffffffff,true);
          if (!_Var10) goto LAB_00111968;
          pcVar22 = *(code **)(((bson_t *)dotkey)->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar17 = bson_iter_symbol(iter,(uint32_t *)apcStack_380);
          _Var10 = bson_utf8_validate(pcVar17,(ulong)apcStack_380[0] & 0xffffffff,true);
          if (!_Var10) goto LAB_00111968;
          pcVar22 = *(code **)((long)dotkey + 0x80);
LAB_001117d4:
          if (pcVar22 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_380[0] & 0xffffffff);
LAB_0011188b:
            cVar12 = (*pcVar22)(iter,puVar35,__s,pcVar17,extraout_RDX_04);
LAB_001118b2:
            if (cVar12 != '\0') {
              return true;
            }
          }
          break;
        case 0xf:
          uStack_3a0 = 0;
          pbStack_398 = (bson_t *)0x0;
          uStack_38c = 0;
          pcVar17 = bson_iter_codewscope(iter,&uStack_3a0,&uStack_38c,(uint8_t **)&pbStack_398);
          _Var10 = bson_utf8_validate(pcVar17,(ulong)uStack_3a0,true);
          if (!_Var10) goto LAB_00111968;
          _Var10 = bson_init_static((bson_t *)apcStack_380,(uint8_t *)pbStack_398,(ulong)uStack_38c)
          ;
          if ((_Var10) &&
             (pcVar22 = *(code **)((bson_t *)((long)dotkey + 0x80))->padding, pcVar22 != (code *)0x0
             )) {
            pbVar32 = (bson_t *)apcStack_380;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar22 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 8);
          if (pcVar22 != (code *)0x0) {
            uVar15 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_380,(uint32_t *)&pbStack_398);
          if (*(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x10) != (code *)0x0) {
            cVar12 = (**(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x10))
                               (iter,puVar35,(ulong)apcStack_380[0] & 0xffffffff,
                                (ulong)pbStack_398 & 0xffffffff,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar22 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x18);
          if (pcVar22 != (code *)0x0) {
            pbVar23 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_380);
          pcVar22 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x38);
LAB_0011181e:
          if (pcVar22 != (code *)0x0) {
            cVar12 = (*pcVar22)(iter,puVar35,(bson_t *)apcStack_380,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_390 == 0x7f) {
            pcVar22 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_390 != 0xff) break;
            pcVar22 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x28);
          }
          if (pcVar22 == (code *)0x0) break;
          puVar35 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)((bson_t *)dotkey)->padding != (code *)0x0) &&
           (cVar12 = (**(code **)((bson_t *)dotkey)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_04), cVar12 != '\0')) {
          return true;
        }
        _Var10 = _bson_iter_next_internal(iter,(char **)&puStack_388,&uStack_390,&_Stack_399);
      } while (_Var10);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_399 == true) &&
         (*(long *)(((bson_t *)((long)dotkey + 0x80))->padding + 0x30) != 0)) {
        sVar18 = strlen((char *)puStack_388);
        _Var10 = bson_utf8_validate((char *)puStack_388,sVar18,false);
        if (_Var10) {
          (**(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x30))
                    (iter,puStack_388,uStack_390,extraout_RDX_04);
          return false;
        }
      }
      if (*(code **)(((bson_t *)dotkey)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)dotkey)->padding + 8))(iter,extraout_RDX_04);
      }
    }
    return false;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)dotkey;
    }
    return SUB81(puVar35,0);
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)dotkey;
    }
    return SUB81(puVar35,0);
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(char **)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = dotkey;
    }
    return SUB81(puVar35,0);
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return SUB81(puVar35,0);
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar35[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar15 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar26 = *(long *)((bson_t *)dotkey)->padding;
      *(long *)(puVar35 + uVar15) = *(long *)dotkey;
      *(long *)((long)(puVar35 + uVar15) + 8) = lVar26;
    }
    return SUB81(puVar35,0);
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    pbStack_460 = unaff_RBX;
    pcStack_458 = unaff_R12;
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)dotkey != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)dotkey;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_660;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      sVar31 = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar38 = false;
      while( true ) {
        sVar6 = ((bson_json_reader_t *)iter)->json->pos;
        if (sVar31 == 0) {
          sVar31 = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)sVar31 < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            return true;
          }
          return true;
        }
        if (sVar31 == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = sVar31;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,sVar31);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar35 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar35,puVar35 + ((bson_json_reader_t *)iter)->advance,
                  sVar31 - ((bson_json_reader_t *)iter)->advance);
          psVar2 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar2 = *psVar2 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return true;
        }
        uVar28 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar28 != 0xffffffffffffffff) &&
           (uVar19 = ((bson_json_reader_t *)iter)->json->pos, uVar24 = uVar19 - uVar28,
           uVar28 <= uVar19 && uVar24 != 0)) {
          if (uVar24 < sVar31) {
            sVar31 = uVar24;
          }
          lVar26 = uVar28 - sVar6;
          if (lVar26 < 1) {
            lVar26 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar26,sVar31);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar38 = true;
        sVar31 = 0;
      }
      if (!bVar38) {
        return false;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        return true;
      }
      return true;
    }
    bson_json_reader_read_cold_1();
    p_Var30 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var30 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      pvVar20 = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      pvVar20 = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var30 + __n + 1) {
        uVar28 = (ulong)(p_Var30 + __n) >> 1 | (ulong)(p_Var30 + __n);
        uVar28 = uVar28 >> 2 | uVar28;
        uVar28 = uVar28 >> 4 | uVar28;
        uVar28 = uVar28 >> 8 | uVar28;
        uVar28 = uVar28 >> 0x10 | uVar28;
        num_bytes = (bson_json_reader_cb)((uVar28 >> 0x20 | uVar28) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        pvVar20 = bson_realloc(pvVar20,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = pvVar20;
      }
    }
    memcpy((bson_json_destroy_cb)
           ((long)pvVar20 + (long)(((bson_json_reader_t *)iter)->producer).dcb),dotkey,__n);
    p_Var30 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var30;
    pvVar20 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var30[(long)pvVar20] = (_func_void_void_ptr)0x0;
    return SUB81(pvVar20,0);
  }
  puVar35 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar15 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar39 = puVar35[uVar15];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type =
       (uint)bVar39;
  switch(bVar39) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar17 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar23 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var10 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var10;
    break;
  case 9:
    pcVar17 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar17 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar23 = (bson_oid_t *)0x0;
    if (puVar35[uVar15] == '\f') {
      uVar15 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar16 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar16;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar35 + uVar15);
      pbVar23 = (bson_oid_t *)(puVar35 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar23,&dst->v_oid);
    break;
  case 0xd:
    if (puVar35[uVar15] == '\r') {
      iVar16 = 1;
      if (1 < *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar16 = iVar16 + -1;
      puVar27 = puVar35 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar16 = 0;
      puVar27 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar16;
    goto LAB_00111c30;
  case 0xe:
    if (puVar35[uVar15] == '\x0e') {
      puVar27 = puVar35 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar16 = 1;
      if (1 < *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar16 = *(int *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar16 = iVar16 + -1;
    }
    else {
      puVar27 = (uint8_t *)0x0;
      iVar16 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar16;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar27;
    break;
  case 0xf:
    pcVar17 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar29 = 0;
    if (puVar35[uVar15] == '\x10') {
      iVar29 = *(int32_t *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar29;
    break;
  case 0x11:
    iVar29 = 0;
    uVar21 = 0;
    if (puVar35[uVar15] == '\x11') {
      uVar21 = *(undefined8 *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar29 = (int32_t)((ulong)uVar21 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar29;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar21;
    break;
  case 0x12:
    if (puVar35[uVar15] == '\x12') {
      pcVar17 = *(char **)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar17 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar17;
    break;
  case 0x13:
    if (puVar35[uVar15] == '\x13') {
      iVar9 = *(int64_t *)
               ((long)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar35 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    }
    break;
  default:
    if ((bVar39 != BSON_TYPE_MAXKEY) && (bVar39 != 0xff)) {
      return false;
    }
  }
  return (_Bool)((char)iter + '0');
  while( true ) {
    uVar19 = (ulong)(uVar14 + 1);
    puVar35 = puVar35 + 1;
    if (uVar15 <= uVar14 + 1) break;
LAB_00110d2e:
    uVar14 = (uint)uVar19;
    if (*puVar35 == '\0') {
      uVar34 = uVar14 + 1;
      goto LAB_00110ab7;
    }
  }
LAB_00110d3e:
  uVar25 = (uint)(((bson_json_reader_t *)iter)->producer).bytes_read;
  goto LAB_00110d0a;
}

Assistant:

bool
bson_iter_find_descendant (bson_iter_t *iter,       /* INOUT */
                           const char *dotkey,      /* IN */
                           bson_iter_t *descendant) /* OUT */
{
   bson_iter_t tmp;
   const char *dot;
   size_t sublen;

   BSON_ASSERT (iter);
   BSON_ASSERT (dotkey);
   BSON_ASSERT (descendant);

   if ((dot = strchr (dotkey, '.'))) {
      sublen = dot - dotkey;
   } else {
      sublen = strlen (dotkey);
   }

   if (_bson_iter_find_with_len (iter, dotkey, (int) sublen)) {
      if (!dot) {
         *descendant = *iter;
         return true;
      }

      if (BSON_ITER_HOLDS_DOCUMENT (iter) || BSON_ITER_HOLDS_ARRAY (iter)) {
         if (bson_iter_recurse (iter, &tmp)) {
            return bson_iter_find_descendant (&tmp, dot + 1, descendant);
         }
      }
   }

   return false;
}